

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall
testing::internal::XmlUnitTestResultPrinter::EscapeXml
          (XmlUnitTestResultPrinter *this,char *str,bool is_attribute)

{
  char *pcVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  size_t extraout_RDX;
  String SVar4;
  undefined6 in_stack_ffffffffffffff90;
  XmlUnitTestResultPrinter *this_00;
  String local_50;
  char local_3e [14];
  char *local_30;
  char *src;
  Message m;
  bool is_attribute_local;
  char *str_local;
  
  this_00 = this;
  m.ss_.ptr_._7_1_ = is_attribute;
  Message::Message((Message *)this);
  pcVar1 = str;
  if (str != (char *)0x0) {
    while (local_30 = pcVar1, *local_30 != '\0') {
      switch(*local_30) {
      case '\"':
        if ((m.ss_.ptr_._7_1_ & 1) == 0) {
          local_3e[0] = '\"';
          Message::operator<<((Message *)&src,local_3e);
        }
        else {
          Message::operator<<((Message *)&src,(char (*) [7])"&quot;");
        }
        break;
      default:
        uVar2 = IsValidXmlCharacter(*local_30);
        if ((bool)uVar2) {
          if (((m.ss_.ptr_._7_1_ & 1) == 0) ||
             (uVar3 = IsNormalizableWhitespace(*local_30), !(bool)uVar3)) {
            Message::operator<<((Message *)&src,local_30);
          }
          else {
            String::Format(&local_50,"&#x%02X;",(ulong)(uint)(int)*local_30);
            Message::operator<<((Message *)&src,&local_50);
            String::~String((String *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_ffffffffffffff90)));
          }
        }
        break;
      case '&':
        Message::operator<<((Message *)&src,(char (*) [6])"&amp;");
        break;
      case '\'':
        if ((m.ss_.ptr_._7_1_ & 1) == 0) {
          local_3e[1] = 0x27;
          Message::operator<<((Message *)&src,local_3e + 1);
        }
        else {
          Message::operator<<((Message *)&src,(char (*) [7])"&apos;");
        }
        break;
      case '<':
        Message::operator<<((Message *)&src,(char (*) [5])"&lt;");
        break;
      case '>':
        Message::operator<<((Message *)&src,(char (*) [5])"&gt;");
      }
      pcVar1 = local_30 + 1;
    }
  }
  Message::GetString((Message *)this_00);
  Message::~Message((Message *)0x15000e);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String XmlUnitTestResultPrinter::EscapeXml(const char* str, bool is_attribute) {
  Message m;

  if (str != NULL) {
    for (const char* src = str; *src; ++src) {
      switch (*src) {
        case '<':
          m << "&lt;";
          break;
        case '>':
          m << "&gt;";
          break;
        case '&':
          m << "&amp;";
          break;
        case '\'':
          if (is_attribute)
            m << "&apos;";
          else
            m << '\'';
          break;
        case '"':
          if (is_attribute)
            m << "&quot;";
          else
            m << '"';
          break;
        default:
          if (IsValidXmlCharacter(*src)) {
            if (is_attribute && IsNormalizableWhitespace(*src))
              m << String::Format("&#x%02X;", unsigned(*src));
            else
              m << *src;
          }
          break;
      }
    }
  }

  return m.GetString();
}